

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool __thiscall QString::startsWith(QString *this,QChar c,CaseSensitivity cs)

{
  long lVar1;
  qsizetype qVar2;
  int in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffc8;
  QChar in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined2 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffda;
  undefined1 local_13;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = size(in_RDI);
  if (qVar2 == 0) {
    local_13 = false;
  }
  else if (in_EDX == 1) {
    at((QString *)CONCAT44(1,CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)),
       (qsizetype)in_RDI);
    local_13 = ::operator==((QChar *)in_RDI,
                            (QChar *)CONCAT17(in_stack_ffffffffffffffcf,
                                              CONCAT16(in_stack_ffffffffffffffce,
                                                       CONCAT24(in_stack_ffffffffffffffcc.ucs,
                                                                in_stack_ffffffffffffffc8))));
  }
  else {
    at((QString *)CONCAT44(in_EDX,CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)),
       (qsizetype)in_RDI);
    foldCase(in_stack_ffffffffffffffcc);
    foldCase(in_stack_ffffffffffffffcc);
    local_13 = ::operator==((QChar *)in_RDI,
                            (QChar *)CONCAT17(in_stack_ffffffffffffffcf,
                                              CONCAT16(in_stack_ffffffffffffffce,
                                                       CONCAT24(in_stack_ffffffffffffffcc.ucs,
                                                                in_stack_ffffffffffffffc8))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_13;
  }
  __stack_chk_fail();
}

Assistant:

bool QString::startsWith(QChar c, Qt::CaseSensitivity cs) const
{
    if (!size())
        return false;
    if (cs == Qt::CaseSensitive)
        return at(0) == c;
    return foldCase(at(0)) == foldCase(c);
}